

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

uint32 __thiscall Js::WebAssemblyModule::GetModuleEnvironmentSize(WebAssemblyModule *this)

{
  uint32 uVar1;
  uint32 uVar2;
  uint offset;
  uint32 size;
  WebAssemblyModule *this_local;
  
  uVar1 = GetWasmFunctionCount(this);
  uVar1 = UInt32Math::Add(3,uVar1);
  uVar2 = GetImportedFunctionCount(this);
  uVar1 = UInt32Math::Add(uVar1,uVar2);
  offset = GetGlobalsByteSize(this);
  uVar2 = WAsmJs::ConvertOffset<unsigned_char,void*>(offset);
  uVar1 = UInt32Math::Add(uVar1,uVar2);
  return uVar1;
}

Assistant:

uint32
WebAssemblyModule::GetModuleEnvironmentSize() const
{
    static const uint DOUBLE_SIZE_IN_INTS = sizeof(double) / sizeof(int);
    // 1 each for memory, table, and signatures
    uint32 size = 3;
    size = UInt32Math::Add(size, GetWasmFunctionCount());
    size = UInt32Math::Add(size, GetImportedFunctionCount());
    size = UInt32Math::Add(size, WAsmJs::ConvertOffset<byte, Js::Var>(GetGlobalsByteSize()));
    return size;
}